

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void affect_to_obj(OBJ_DATA *obj,OBJ_AFFECT_DATA *paf)

{
  OBJ_AFFECT_DATA *__dest;
  void *in_RSI;
  long in_RDI;
  OBJ_AFFECT_DATA *paf_new;
  bool in_stack_00000027;
  OBJ_AFFECT_DATA *in_stack_00000028;
  OBJ_DATA *in_stack_00000030;
  
  __dest = new_affect_obj();
  memcpy(__dest,in_RSI,0x50);
  __dest->next = *(OBJ_AFFECT_DATA **)(in_RDI + 0x40);
  *(OBJ_AFFECT_DATA **)(in_RDI + 0x40) = __dest;
  affect_modify_obj(in_stack_00000030,in_stack_00000028,in_stack_00000027);
  return;
}

Assistant:

void affect_to_obj(OBJ_DATA *obj, OBJ_AFFECT_DATA *paf)
{
	OBJ_AFFECT_DATA *paf_new;

	paf_new = new_affect_obj();

	*paf_new = *paf;
	paf_new->next = obj->affected;
	obj->affected = paf_new;

	affect_modify_obj(obj, paf_new, true);
}